

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocompact_test.cc
# Opt level: O0

string * __thiscall
leveldb::AutoCompactTest::Key_abi_cxx11_(string *__return_storage_ptr__,AutoCompactTest *this,int i)

{
  allocator local_89;
  char local_88 [8];
  char buf [100];
  int i_local;
  AutoCompactTest *this_local;
  
  snprintf(local_88,100,"key%06d",(ulong)(uint)i);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_88,&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return __return_storage_ptr__;
}

Assistant:

std::string Key(int i) {
    char buf[100];
    std::snprintf(buf, sizeof(buf), "key%06d", i);
    return std::string(buf);
  }